

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_setclosureroot(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQClosure *pSVar2;
  SQWeakRef *pSVar3;
  SQObjectPtr *pSVar4;
  SQObjectPtr *pSVar5;
  SQWeakRef *pSVar6;
  char *err;
  
  if (idx < 0) {
    pSVar4 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar4 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  pSVar5 = SQVM::GetUp(v,-1);
  if ((pSVar4->super_SQObject)._type == OT_CLOSURE) {
    if ((pSVar5->super_SQObject)._type == OT_TABLE) {
      pSVar2 = (pSVar4->super_SQObject)._unVal.pClosure;
      pSVar6 = SQRefCounted::GetWeakRef((pSVar5->super_SQObject)._unVal.pRefCounted,OT_TABLE);
      pSVar3 = pSVar2->_root;
      if (pSVar3 != (SQWeakRef *)0x0) {
        pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar3->super_SQRefCounted)._vptr_SQRefCounted[2])();
        }
      }
      pSVar2->_root = pSVar6;
      pSVar1 = &(pSVar6->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQVM::Pop(v);
      return 0;
    }
    err = "invalid type";
  }
  else {
    err = "closure expected";
  }
  sq_throwerror(v,err);
  return -1;
}

Assistant:

SQRESULT sq_setclosureroot(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &c = stack_get(v,idx);
    SQObject o = stack_get(v, -1);
    if(!sq_isclosure(c)) return sq_throwerror(v, _SC("closure expected"));
    if(sq_istable(o)) {
        _closure(c)->SetRoot(_table(o)->GetWeakRef(OT_TABLE));
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type"));
}